

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbocompression.h
# Opt level: O2

uint8_t * turbocompress64(uint64_t *in,uint32_t length,uint8_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint8_t *local_40;
  uint64_t *in_local;
  
  *(uint32_t *)out = length;
  if (length == 0) {
    local_40 = out + 4;
  }
  else {
    uVar2 = *in;
    uVar6 = uVar2;
    for (uVar4 = 1; length != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = in[uVar4];
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      if (uVar1 < uVar6) {
        uVar6 = uVar1;
      }
    }
    uVar4 = 0x3f;
    if (uVar2 - uVar6 != 0) {
      for (; uVar2 - uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    *(ulong *)(out + 4) = uVar6;
    *(ulong *)(out + 0xc) = uVar2;
    lVar5 = 0;
    if (uVar2 != uVar6) {
      lVar5 = (uVar4 ^ 0xffffffffffffffc0) + 0x41;
    }
    local_40 = out + 0x14;
    uVar3 = 0;
    in_local = in;
    while (uVar3 + 0x20 <= length) {
      (*funcForPackArr64[lVar5])(uVar6,&in_local,&local_40);
      uVar3 = uVar3 + 0x20;
    }
    __n = (ulong)(length - uVar3) * 8;
    memcpy(local_40,in_local,__n);
    local_40 = local_40 + __n;
  }
  return local_40;
}

Assistant:

inline uint8_t *turbocompress64(const uint64_t *in, uint32_t length,
                              uint8_t *out) {
  memcpy(out, &length, sizeof(length));
  out += sizeof(length);
  if (length == 0)
    return out;
  uint64_t m = in[0];
  uint64_t M = in[0];
  for (uint32_t i = 1; i < length; ++i) {
    if (in[i] > M)
      M = in[i];
    if (in[i] < m)
      m = in[i];
  }
  int b = bits64(static_cast<uint64_t>(M - m));
  memcpy(out, &m, sizeof(m));
  out += sizeof(m);
  memcpy(out, &M, sizeof(M));
  out += sizeof(M);

  uint32_t k = 0;
  for (; k + 32 <= length; k += 32) {
    funcForPackArr64[b](m, &in, &out);
  }
  // we could pack the rest, but we don't  bother
  memcpy(out, in, (length - k) * sizeof(uint64_t));
  out += (length - k) * sizeof(uint64_t);
  return out;
}